

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

__m128i shuffle_filter_convolve8_8_ssse3(__m128i *s,int16_t *filter)

{
  int16_t *in_RSI;
  __m128i *in_RDI;
  __m128i alVar1;
  __m128i f [4];
  longlong alStack_58 [10];
  __m128i *local_8;
  
  local_8 = in_RDI;
  shuffle_filter_ssse3(in_RSI,(__m128i *)alStack_58);
  alVar1 = convolve8_8_ssse3(local_8,(__m128i *)alStack_58);
  alVar1[0] = alVar1[0];
  alVar1[1] = alVar1[1];
  return alVar1;
}

Assistant:

static inline __m128i shuffle_filter_convolve8_8_ssse3(
    const __m128i *const s, const int16_t *const filter) {
  __m128i f[4];
  shuffle_filter_ssse3(filter, f);
  return convolve8_8_ssse3(s, f);
}